

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

MessageLite * google::protobuf::internal::DuplicateIfNonNullInternal(MessageLite *message)

{
  MessageLite *ret;
  MessageLite *message_local;
  
  if (message == (MessageLite *)0x0) {
    message_local = (MessageLite *)0x0;
  }
  else {
    message_local = MessageLite::New(message);
    MessageLite::CheckTypeAndMergeFrom(message_local,message);
  }
  return message_local;
}

Assistant:

MessageLite* DuplicateIfNonNullInternal(MessageLite* message) {
  if (message) {
    MessageLite* ret = message->New();
    ret->CheckTypeAndMergeFrom(*message);
    return ret;
  } else {
    return nullptr;
  }
}